

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O3

bool_t beltHMACStepV2(octet *mac,size_t mac_len,void *state)

{
  bool_t bVar1;
  
  beltHMACStepG_internal(state);
  bVar1 = memEq(mac,(void *)((long)state + 0xa0),mac_len);
  return bVar1;
}

Assistant:

bool_t beltHMACStepV2(const octet mac[], size_t mac_len, void* state)
{
	belt_hmac_st* st = (belt_hmac_st*)state;
	ASSERT(mac_len <= 32);
	ASSERT(memIsValid(mac, mac_len));
	beltHMACStepG_internal(state);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevU32(st->h1_out);
	beltBlockRevU32(st->h1_out + 4);
#endif
	return memEq(mac, st->h1_out, mac_len);
}